

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotErrorBars<double>
               (char *label_id,double *xs,double *ys,double *err,int count,int offset,int stride)

{
  undefined1 local_60 [8];
  GetterError<double> getter;
  int offset_local;
  int count_local;
  double *err_local;
  double *ys_local;
  double *xs_local;
  char *label_id_local;
  
  getter.Stride = offset;
  getter._44_4_ = count;
  GetterError<double>::GetterError
            ((GetterError<double> *)local_60,xs,ys,err,err,count,offset,stride);
  PlotErrorBarsEx<ImPlot::GetterError<double>>(label_id,(GetterError<double> *)local_60);
  return;
}

Assistant:

void PlotErrorBars(const char* label_id, const T* xs, const T* ys, const T* err, int count, int offset, int stride) {
    GetterError<T> getter(xs, ys, err, err, count, offset, stride);
    PlotErrorBarsEx(label_id, getter);
}